

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* wasm::ParamUtils::getUsedParams
            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *__return_storage_ptr__,Function *func,Module *module)

{
  bool bVar1;
  reference puVar2;
  uint local_344;
  iterator iStack_340;
  uint live;
  iterator __end2;
  iterator __begin2;
  SetOfLocals *__range2;
  SetOfLocals *sortedLiveness;
  undefined1 local_308 [8];
  ParamLiveness walker;
  Module *module_local;
  Function *func_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *usedParams;
  
  walker._736_8_ = module;
  getUsedParams::ParamLiveness::ParamLiveness((ParamLiveness *)local_308);
  Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::setModule
            ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)local_308,
             (Module *)walker._736_8_);
  Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::walkFunction
            ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)local_308,func);
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule == (Module *)0x0)
  {
    memset(__return_storage_ptr__,0,0x38);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set(__return_storage_ptr__);
  }
  else {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set(__return_storage_ptr__);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                        .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)
    ;
    iStack_340 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            walker.
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            .
                            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                            .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            currModule);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffcc0), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_344 = *puVar2;
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(__return_storage_ptr__,&local_344);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
  }
  getUsedParams::ParamLiveness::~ParamLiveness((ParamLiveness *)local_308);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<Index> getUsedParams(Function* func, Module* module) {
  // To find which params are used, compute liveness at the entry.
  // TODO: We could write bespoke code here rather than reuse LivenessWalker, as
  //       we only need liveness at the entry. The code below computes it for
  //       the param indexes in the entire function. However, there are usually
  //       very few params (compared to locals, which we ignore here), so this
  //       may be fast enough, and is very simple.
  struct ParamLiveness
    : public LivenessWalker<ParamLiveness, Visitor<ParamLiveness>> {
    using Super = LivenessWalker<ParamLiveness, Visitor<ParamLiveness>>;

    // Branches outside of the function can be ignored, as we only look at
    // locals, which vanish when we leave.
    bool ignoreBranchesOutsideOfFunc = true;

    // Ignore unreachable code and non-params.
    static void doVisitLocalGet(ParamLiveness* self, Expression** currp) {
      auto* get = (*currp)->cast<LocalGet>();
      if (self->currBasicBlock && self->getFunction()->isParam(get->index)) {
        Super::doVisitLocalGet(self, currp);
      }
    }
    static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }
  } walker;
  walker.setModule(module);
  walker.walkFunction(func);

  if (!walker.entry) {
    // Empty function: nothing is used.
    return {};
  }

  // We now have a sorted vector of the live params at the entry. Convert that
  // to a set.
  auto& sortedLiveness = walker.entry->contents.start;
  std::unordered_set<Index> usedParams;
  for (auto live : sortedLiveness) {
    usedParams.insert(live);
  }
  return usedParams;
}